

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O1

void av1_build_compound_diffwtd_mask_c
               (uint8_t *mask,DIFFWTD_MASK_TYPE mask_type,uint8_t *src0,int src0_stride,
               uint8_t *src1,int src1_stride,int h,int w)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  undefined7 in_register_00000031;
  ulong uVar5;
  
  iVar4 = (int)CONCAT71(in_register_00000031,mask_type);
  if (iVar4 == 1) {
    if (0 < h) {
      uVar2 = 0;
      do {
        if (0 < w) {
          uVar5 = 0;
          do {
            uVar3 = (uint)src0[uVar5] - (uint)src1[uVar5];
            uVar1 = -uVar3;
            if (0 < (int)uVar3) {
              uVar1 = uVar3;
            }
            mask[uVar5] = '\x1a' - (char)(((ulong)uVar1 & 0xff) >> 4);
            uVar5 = uVar5 + 1;
          } while ((uint)w != uVar5);
        }
        uVar2 = uVar2 + 1;
        mask = mask + w;
        src1 = src1 + src1_stride;
        src0 = src0 + src0_stride;
      } while (uVar2 != (uint)h);
    }
  }
  else if ((iVar4 == 0) && (0 < h)) {
    uVar2 = 0;
    do {
      if (0 < w) {
        uVar5 = 0;
        do {
          uVar3 = (uint)src0[uVar5] - (uint)src1[uVar5];
          uVar1 = -uVar3;
          if (0 < (int)uVar3) {
            uVar1 = uVar3;
          }
          mask[uVar5] = (char)(((ulong)uVar1 & 0xff) >> 4) + '&';
          uVar5 = uVar5 + 1;
        } while ((uint)w != uVar5);
      }
      uVar2 = uVar2 + 1;
      mask = mask + w;
      src1 = src1 + src1_stride;
      src0 = src0 + src0_stride;
    } while (uVar2 != (uint)h);
  }
  return;
}

Assistant:

void av1_build_compound_diffwtd_mask_c(uint8_t *mask,
                                       DIFFWTD_MASK_TYPE mask_type,
                                       const uint8_t *src0, int src0_stride,
                                       const uint8_t *src1, int src1_stride,
                                       int h, int w) {
  switch (mask_type) {
    case DIFFWTD_38:
      diffwtd_mask(mask, 0, 38, src0, src0_stride, src1, src1_stride, h, w);
      break;
    case DIFFWTD_38_INV:
      diffwtd_mask(mask, 1, 38, src0, src0_stride, src1, src1_stride, h, w);
      break;
    default: assert(0);
  }
}